

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

void do_caselesscmp(compiler_common *common)

{
  sljit_compiler *compiler_00;
  sljit_s32 sVar1;
  sljit_jump *psVar2;
  sljit_label *psVar3;
  sljit_jump *jump_00;
  int local_38;
  uint local_34;
  int opt_type;
  int lcc_table;
  int char2_reg;
  int char1_reg;
  sljit_label *label;
  sljit_jump *jump;
  sljit_compiler *compiler;
  compiler_common *common_local;
  
  compiler_00 = common->compiler;
  local_38 = 0;
  sVar1 = sljit_get_register_index(3);
  if (sVar1 < 0) {
    opt_type = 0xc;
    local_34 = 0xb;
  }
  else {
    opt_type = 5;
    local_34 = 3;
  }
  sVar1 = sljit_emit_mem(compiler_00,0x1223,0xd,0x81,2);
  if (sVar1 == 0) {
    local_38 = 1;
  }
  else {
    sVar1 = sljit_emit_mem(compiler_00,0xa23,0xd,0x81,2);
    if (sVar1 == 0) {
      local_38 = 2;
    }
  }
  sljit_emit_fast_enter(compiler_00,0x8e,0);
  sljit_emit_op2(compiler_00,0x62,2,0,2,0,4,0);
  sljit_emit_op1(compiler_00,0x20,0x8e,8,0xd,0);
  if (opt_type == 0xc) {
    sljit_emit_op1(compiler_00,0x20,3,0,0xc,0);
    sljit_emit_op1(compiler_00,0x20,5,0,local_34,0);
  }
  sljit_emit_op1(compiler_00,0x20,local_34,0,0x40,common->lcc);
  if (local_38 == 1) {
    _char2_reg = sljit_emit_label(compiler_00);
    sljit_emit_mem(compiler_00,0x1023,0xd,0x81,2);
    sljit_emit_mem(compiler_00,0x1023,opt_type,0x82,2);
  }
  else if (local_38 == 2) {
    sljit_emit_op2(compiler_00,0x62,1,0,1,0,0x40,2);
    sljit_emit_op2(compiler_00,0x62,2,0,2,0,0x40,2);
    _char2_reg = sljit_emit_label(compiler_00);
    sljit_emit_mem(compiler_00,0x823,0xd,0x81,2);
    sljit_emit_mem(compiler_00,0x823,opt_type,0x82,2);
  }
  else {
    _char2_reg = sljit_emit_label(compiler_00);
    sljit_emit_op1(compiler_00,0x23,0xd,0,0x81,0);
    sljit_emit_op1(compiler_00,0x23,opt_type,0,0x82,0);
    sljit_emit_op2(compiler_00,0x60,1,0,1,0,0x40,2);
  }
  psVar2 = sljit_emit_cmp(compiler_00,4,0xd,0,0x40,0xff);
  sljit_emit_op1(compiler_00,0x21,0xd,0,local_34 | 0xd80,0);
  psVar3 = sljit_emit_label(compiler_00);
  sljit_set_label(psVar2,psVar3);
  psVar2 = sljit_emit_cmp(compiler_00,4,opt_type,0,0x40,0xff);
  sljit_emit_op1(compiler_00,0x21,opt_type,0,local_34 | 0x80 | opt_type << 8,0);
  psVar3 = sljit_emit_label(compiler_00);
  sljit_set_label(psVar2,psVar3);
  if (local_38 == 0) {
    sljit_emit_op2(compiler_00,0x60,2,0,2,0,0x40,2);
  }
  psVar2 = sljit_emit_cmp(compiler_00,1,0xd,0,opt_type,0);
  sljit_emit_op2(compiler_00,0x262,4,0,4,0,0x40,2);
  jump_00 = sljit_emit_jump(compiler_00,1);
  sljit_set_label(jump_00,_char2_reg);
  psVar3 = sljit_emit_label(compiler_00);
  sljit_set_label(psVar2,psVar3);
  sljit_emit_op1(compiler_00,0x20,1,0,0x8e,0);
  if (local_38 == 2) {
    sljit_emit_op2(compiler_00,0x60,2,0,2,0,0x40,2);
  }
  if (opt_type == 0xc) {
    sljit_emit_op1(compiler_00,0x20,0xc,0,3,0);
    sljit_emit_op1(compiler_00,0x20,local_34,0,5,0);
  }
  sljit_emit_op1(compiler_00,0x20,0xd,0,0x8e,8);
  sljit_emit_fast_return(compiler_00,1,0);
  return;
}

Assistant:

static void do_caselesscmp(compiler_common *common)
{
DEFINE_COMPILER;
struct sljit_jump *jump;
struct sljit_label *label;
int char1_reg = STR_END;
int char2_reg;
int lcc_table;
int opt_type = 0;

if (sljit_get_register_index(TMP3) < 0)
  {
  char2_reg = STACK_TOP;
  lcc_table = STACK_LIMIT;
  }
else
  {
  char2_reg = RETURN_ADDR;
  lcc_table = TMP3;
  }

if (sljit_emit_mem(compiler, MOV_UCHAR | SLJIT_MEM_SUPP | SLJIT_MEM_POST, char1_reg, SLJIT_MEM1(TMP1), IN_UCHARS(1)) == SLJIT_SUCCESS)
  opt_type = 1;
else if (sljit_emit_mem(compiler, MOV_UCHAR | SLJIT_MEM_SUPP | SLJIT_MEM_PRE, char1_reg, SLJIT_MEM1(TMP1), IN_UCHARS(1)) == SLJIT_SUCCESS)
  opt_type = 2;

sljit_emit_fast_enter(compiler, SLJIT_MEM1(SLJIT_SP), LOCALS0);
OP2(SLJIT_SUB, STR_PTR, 0, STR_PTR, 0, TMP2, 0);

OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), LOCALS1, char1_reg, 0);

if (char2_reg == STACK_TOP)
  {
  OP1(SLJIT_MOV, TMP3, 0, char2_reg, 0);
  OP1(SLJIT_MOV, RETURN_ADDR, 0, lcc_table, 0);
  }

OP1(SLJIT_MOV, lcc_table, 0, SLJIT_IMM, common->lcc);

if (opt_type == 1)
  {
  label = LABEL();
  sljit_emit_mem(compiler, MOV_UCHAR | SLJIT_MEM_POST, char1_reg, SLJIT_MEM1(TMP1), IN_UCHARS(1));
  sljit_emit_mem(compiler, MOV_UCHAR | SLJIT_MEM_POST, char2_reg, SLJIT_MEM1(STR_PTR), IN_UCHARS(1));
  }
else if (opt_type == 2)
  {
  OP2(SLJIT_SUB, TMP1, 0, TMP1, 0, SLJIT_IMM, IN_UCHARS(1));
  OP2(SLJIT_SUB, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(1));

  label = LABEL();
  sljit_emit_mem(compiler, MOV_UCHAR | SLJIT_MEM_PRE, char1_reg, SLJIT_MEM1(TMP1), IN_UCHARS(1));
  sljit_emit_mem(compiler, MOV_UCHAR | SLJIT_MEM_PRE, char2_reg, SLJIT_MEM1(STR_PTR), IN_UCHARS(1));
  }
else
  {
  label = LABEL();
  OP1(MOV_UCHAR, char1_reg, 0, SLJIT_MEM1(TMP1), 0);
  OP1(MOV_UCHAR, char2_reg, 0, SLJIT_MEM1(STR_PTR), 0);
  OP2(SLJIT_ADD, TMP1, 0, TMP1, 0, SLJIT_IMM, IN_UCHARS(1));
  }

#if PCRE2_CODE_UNIT_WIDTH != 8
jump = CMP(SLJIT_GREATER, char1_reg, 0, SLJIT_IMM, 255);
#endif
OP1(SLJIT_MOV_U8, char1_reg, 0, SLJIT_MEM2(lcc_table, char1_reg), 0);
#if PCRE2_CODE_UNIT_WIDTH != 8
JUMPHERE(jump);
jump = CMP(SLJIT_GREATER, char2_reg, 0, SLJIT_IMM, 255);
#endif
OP1(SLJIT_MOV_U8, char2_reg, 0, SLJIT_MEM2(lcc_table, char2_reg), 0);
#if PCRE2_CODE_UNIT_WIDTH != 8
JUMPHERE(jump);
#endif

if (opt_type == 0)
  OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(1));

jump = CMP(SLJIT_NOT_EQUAL, char1_reg, 0, char2_reg, 0);
OP2(SLJIT_SUB | SLJIT_SET_Z, TMP2, 0, TMP2, 0, SLJIT_IMM, IN_UCHARS(1));
JUMPTO(SLJIT_NOT_ZERO, label);

JUMPHERE(jump);
OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), LOCALS0);

if (opt_type == 2)
  OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(1));

if (char2_reg == STACK_TOP)
  {
  OP1(SLJIT_MOV, char2_reg, 0, TMP3, 0);
  OP1(SLJIT_MOV, lcc_table, 0, RETURN_ADDR, 0);
  }

OP1(SLJIT_MOV, char1_reg, 0, SLJIT_MEM1(SLJIT_SP), LOCALS1);
sljit_emit_fast_return(compiler, TMP1, 0);
}